

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeHeap.cpp
# Opt level: O2

Expression * __thiscall
wasm::SafeHeap::makeAlignCheck
          (SafeHeap *this,Address align,Builder *builder,Index local,Module *module,Name memoryName)

{
  Memory *pMVar1;
  Unary *value;
  Const *right;
  Binary *condition;
  Call *ifTrue;
  If *pIVar2;
  ulong uVar3;
  optional<wasm::Type> type;
  _Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_48;
  
  pMVar1 = Module::getMemory(module,memoryName);
  value = (Unary *)Builder::makeLocalGet(builder,local,(Type)(pMVar1->addressType).id);
  if ((pMVar1->addressType).id == 3) {
    value = Builder::makeUnary(builder,WrapInt64,(Expression *)value);
  }
  right = Builder::makeConst<int>(builder,(int)align.addr + -1);
  condition = Builder::makeBinary(builder,AndInt32,(Expression *)value,(Expression *)right);
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar3 = 0;
  ifTrue = Builder::makeCall(builder,(Name)(this->alignfault).super_IString.str,
                             (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                             &local_48,(Type)0x0,false);
  type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._8_8_ = 0;
  type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)uVar3;
  pIVar2 = Builder::makeIf(builder,(Expression *)condition,(Expression *)ifTrue,(Expression *)0x0,
                           type);
  std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
            (&local_48);
  return (Expression *)pIVar2;
}

Assistant:

Expression* makeAlignCheck(Address align,
                             Builder& builder,
                             Index local,
                             Module* module,
                             Name memoryName) {
    auto memory = module->getMemory(memoryName);
    auto addressType = memory->addressType;
    Expression* ptrBits = builder.makeLocalGet(local, addressType);
    if (memory->is64()) {
      ptrBits = builder.makeUnary(WrapInt64, ptrBits);
    }
    return builder.makeIf(
      builder.makeBinary(
        AndInt32, ptrBits, builder.makeConst(int32_t(align - 1))),
      builder.makeCall(alignfault, {}, Type::none));
  }